

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
EagerPromiseNode<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
::~EagerPromiseNode(EagerPromiseNode<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
                    *this)

{
  ResponseHook *pRVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  
  if (((this->result).value.ptr.isSet == true) &&
     (pRVar1 = (this->result).value.ptr.field_1.value.hook.ptr, pRVar1 != (ResponseHook *)0x0)) {
    (this->result).value.ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    pDVar2 = (this->result).value.ptr.field_1.value.hook.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2]));
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  (this->super_EagerPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_0064c948;
  (this->super_EagerPromiseNodeBase).super_Event._vptr_Event =
       (_func_int **)&PTR_getInnerForTrace_0064c980;
  pPVar3 = (this->super_EagerPromiseNodeBase).dependency.ptr;
  if (pPVar3 != (PromiseNode *)0x0) {
    (this->super_EagerPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    pDVar2 = (this->super_EagerPromiseNodeBase).dependency.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pPVar3->_vptr_PromiseNode + (long)pPVar3->_vptr_PromiseNode[-2]));
  }
  Event::~Event(&(this->super_EagerPromiseNodeBase).super_Event);
  return;
}

Assistant:

EagerPromiseNode(Own<PromiseNode>&& dependency)
      : EagerPromiseNodeBase(kj::mv(dependency), result) {}